

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

void __thiscall helics::FederateState::generateProfilingMarker(FederateState *this)

{
  BaseType BVar1;
  long lVar2;
  _Alloc_hider __src;
  baseType bVar3;
  undefined8 uVar4;
  string *psVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  string_view logMessageSource;
  format_args args;
  string_view message_00;
  string message;
  ActionMessage prof;
  string local_f8;
  undefined1 local_d8 [128];
  size_t local_58;
  byte *local_48;
  
  bVar3 = std::chrono::_V2::steady_clock::now();
  uVar4 = std::chrono::_V2::system_clock::now();
  BVar1 = (this->global_id)._M_i.gid;
  psVar5 = fedStateString_abi_cxx11_((this->state)._M_i);
  lVar2 = (this->time_granted).internalTimeCode;
  local_d8._80_8_ = (double)(lVar2 % 1000000000) * 1e-09 + (double)(lVar2 / 1000000000);
  local_d8._0_8_ = (this->name)._M_dataplus._M_p;
  local_d8._8_8_ = (this->name)._M_string_length;
  local_d8._32_8_ = (psVar5->_M_dataplus)._M_p;
  local_d8._40_8_ = psVar5->_M_string_length;
  fmt.size_ = 0xa33d1d;
  fmt.data_ = (char *)0x34;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_d8;
  local_d8._16_4_ = BVar1;
  local_d8._48_8_ = bVar3;
  local_d8._64_8_ = uVar4;
  ::fmt::v11::vformat_abi_cxx11_
            (&local_f8,(v11 *)"<PROFILING>{}[{}]({})MARKER<{}|{}>[t={}]</PROFILING>",fmt,args);
  if (this->mLocalProfileCapture == true) {
    logMessageSource._M_str = (this->name)._M_dataplus._M_p;
    logMessageSource._M_len = (this->name)._M_string_length;
    message_00._M_str = local_f8._M_dataplus._M_p;
    message_00._M_len = local_f8._M_string_length;
    logMessage(this,2,logMessageSource,message_00,false);
  }
  else if (this->mParent != (CommonCore *)0x0) {
    ActionMessage::ActionMessage
              ((ActionMessage *)local_d8,cmd_profiler_data,
               (GlobalFederateId)(this->global_id)._M_i.gid,(GlobalFederateId)0x0);
    __src._M_p = local_f8._M_dataplus._M_p;
    if ((byte *)local_f8._M_dataplus._M_p == local_48) {
      local_58 = local_f8._M_string_length;
    }
    else {
      SmallBuffer::reserve((SmallBuffer *)(local_d8 + 0x40),local_f8._M_string_length);
      local_58 = local_f8._M_string_length;
      if (local_f8._M_string_length != 0) {
        memcpy(local_48,__src._M_p,local_f8._M_string_length);
      }
    }
    BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,(ActionMessage *)local_d8);
    ActionMessage::~ActionMessage((ActionMessage *)local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FederateState::generateProfilingMarker()
{
    auto ctime = std::chrono::steady_clock::now();
    auto gtime = std::chrono::system_clock::now();
    const std::string message = fmt::format(
        "<PROFILING>{}[{}]({})MARKER<{}|{}>[t={}]</PROFILING>",
        name,
        global_id.load().baseValue(),
        fedStateString(getState()),
        std::chrono::duration_cast<std::chrono::nanoseconds>(ctime.time_since_epoch()).count(),
        std::chrono::duration_cast<std::chrono::nanoseconds>(gtime.time_since_epoch()).count(),
        static_cast<double>(time_granted));

    if (mLocalProfileCapture) {
        logMessage(HELICS_LOG_LEVEL_PROFILING, name, message);
    } else {
        if (mParent != nullptr) {
            ActionMessage prof(CMD_PROFILER_DATA, global_id.load(), parent_broker_id);
            prof.payload = message;
            mParent->addActionMessage(std::move(prof));
        }
    }
}